

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::MemoryLeakDetector(MemoryLeakDetector *this,MemoryLeakFailure *reporter)

{
  SimpleMutex *this_00;
  MemoryLeakFailure *reporter_local;
  MemoryLeakDetector *this_local;
  
  this->_vptr_MemoryLeakDetector = (_func_int **)&PTR__MemoryLeakDetector_0042f2d0;
  MemoryLeakOutputStringBuffer::MemoryLeakOutputStringBuffer(&this->outputBuffer_);
  MemoryLeakDetectorTable::MemoryLeakDetectorTable(&this->memoryTable_);
  this->doAllocationTypeChecking_ = true;
  this->allocationSequenceNumber_ = 1;
  this->current_period_ = mem_leak_period_disabled;
  this->current_allocation_stage_ = '\0';
  this->reporter_ = reporter;
  this_00 = (SimpleMutex *)
            operator_new(8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/MemoryLeakDetector.cpp"
                         ,0x1da);
  SimpleMutex::SimpleMutex(this_00);
  this->mutex_ = this_00;
  return;
}

Assistant:

MemoryLeakDetector::MemoryLeakDetector(MemoryLeakFailure* reporter)
{
    doAllocationTypeChecking_ = true;
    allocationSequenceNumber_ = 1;
    current_period_ = mem_leak_period_disabled;
    current_allocation_stage_ = 0;
    reporter_ = reporter;
    mutex_ = new SimpleMutex;
}